

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_bspline_to_bezier(SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  HairSetNode *this_00;
  ulong uVar5;
  Ref<embree::SceneGraph::Node> local_68;
  Ref<embree::SceneGraph::Node> local_60;
  Ref<embree::SceneGraph::Node> local_58;
  Node *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar1 = (long *)0x0;
  }
  else {
    plVar1 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (plVar1 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar2 = (long *)0x0;
    }
    else {
      plVar2 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    if (plVar2 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      local_50 = (Node *)this;
      if (plVar3 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          this_00 = (HairSetNode *)0x0;
        }
        else {
          this_00 = (HairSetNode *)
                    __dynamic_cast(node->ptr,&Node::typeinfo,&HairSetNode::typeinfo,0);
        }
        if (this_00 != (HairSetNode *)0x0) {
          (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
          HairSetNode::convert_bspline_to_bezier(this_00);
          (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
        }
      }
      else {
        (**(code **)(*plVar3 + 0x10))(plVar3);
        lVar4 = plVar3[0xd];
        if (plVar3[0xe] != lVar4) {
          uVar5 = 0;
          do {
            local_68.ptr = *(Node **)(lVar4 + uVar5 * 8);
            if (local_68.ptr != (Node *)0x0) {
              (*((local_68.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            convert_bspline_to_bezier((SceneGraph *)&local_48,&local_68);
            if (local_48 != (long *)0x0) {
              (**(code **)(*local_48 + 0x18))();
            }
            if (local_68.ptr != (Node *)0x0) {
              (*((local_68.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
            uVar5 = uVar5 + 1;
            lVar4 = plVar3[0xd];
          } while (uVar5 < (ulong)(plVar3[0xe] - lVar4 >> 3));
        }
      }
      this = (SceneGraph *)local_50;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x18))(plVar3);
      }
    }
    else {
      (**(code **)(*plVar2 + 0x10))(plVar2);
      local_60.ptr = (Node *)plVar2[0x10];
      if (local_60.ptr != (Node *)0x0) {
        (*((local_60.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_bspline_to_bezier((SceneGraph *)&local_40,&local_60);
      if (local_40 != (long *)0x0) {
        (**(code **)(*local_40 + 0x18))();
      }
      if (local_60.ptr != (Node *)0x0) {
        (*((local_60.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x18))(plVar2);
    }
  }
  else {
    (**(code **)(*plVar1 + 0x10))(plVar1);
    local_58.ptr = (Node *)plVar1[0x13];
    if (local_58.ptr != (Node *)0x0) {
      (*((local_58.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    convert_bspline_to_bezier((SceneGraph *)&local_38,&local_58);
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 0x18))();
    }
    if (local_58.ptr != (Node *)0x0) {
      (*((local_58.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  }
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x18))(plVar1);
  }
  (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_bspline_to_bezier(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      convert_bspline_to_bezier(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      convert_bspline_to_bezier(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        convert_bspline_to_bezier(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::HairSetNode> hmesh = node.dynamicCast<SceneGraph::HairSetNode>()) {
      hmesh->convert_bspline_to_bezier();
    }
    return node;
  }